

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

int vtresize(int force,int newrow,int newcol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  score *psVar4;
  video **ppvVar5;
  video *pvVar6;
  ulong uVar7;
  void *pvVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  iVar3 = ncol;
  iVar2 = nrow;
  if (newcol < 1 || newrow < 1) {
    return 0;
  }
  if (((force == 0 && ((vtresize_first_run ^ 1) & 1) == 0) && nrow == newrow) && ncol == newcol) {
    return 1;
  }
  if ((vtresize_first_run & 1) == 0) {
    blanks.v_hash = 0;
    blanks.v_flag = 0;
    blanks.v_color = 0;
    blanks._6_2_ = 0;
    blanks.v_cost = 0;
    blanks._12_4_ = 0;
    blanks.v_text = (char *)0x0;
  }
  else if ((nrow == newrow & vtresize_first_run) != 0) goto LAB_0010a590;
  iVar1 = nrow * 2 + -2;
  iVar10 = iVar1;
  if (nrow == 0) {
    iVar10 = 0;
  }
  if ((newrow < nrow) && (uVar12 = newrow * 2 - 2, (int)uVar12 < iVar1)) {
    lVar11 = (ulong)uVar12 * 0x18 + 0x10;
    do {
      free(*(void **)((long)&video->v_hash + lVar11));
      *(undefined8 *)((long)&video->v_hash + lVar11) = 0;
      lVar11 = lVar11 + 0x18;
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < nrow * 2 + -2);
  }
  psVar4 = (score *)reallocarray(score,(ulong)(uint)newrow,(ulong)(uint)newrow * 0xc);
  if (psVar4 == (score *)0x0) {
    panic("out of memory in display code");
  }
  uVar13 = (ulong)(newrow - 1U);
  score = psVar4;
  ppvVar5 = (video **)reallocarray(vscreen,uVar13,8);
  if (ppvVar5 == (video **)0x0) {
    panic("out of memory in display code");
  }
  vscreen = ppvVar5;
  ppvVar5 = (video **)reallocarray(pscreen,uVar13,8);
  if (ppvVar5 == (video **)0x0) {
    panic("out of memory in display code");
  }
  pscreen = ppvVar5;
  pvVar6 = (video *)reallocarray(video,uVar13,0x30);
  if (pvVar6 == (video *)0x0) {
    panic("out of memory in display code");
  }
  video = pvVar6;
  if (iVar10 < (int)((newrow - 1U) * 2)) {
    memset(pvVar6 + iVar10,0,(ulong)((newrow * 2 - iVar10) - 4) * 0x18 + 0x30);
  }
  if (1 < newrow) {
    uVar7 = 0;
    do {
      vscreen[uVar7] = pvVar6;
      pscreen[uVar7] = pvVar6 + 1;
      uVar7 = uVar7 + 1;
      pvVar6 = pvVar6 + 2;
    } while (uVar13 != uVar7);
  }
LAB_0010a590:
  if (((iVar2 != newrow) || (iVar3 != newcol)) ||
     (pcVar9 = blanks.v_text, (vtresize_first_run & 1) == 0)) {
    uVar12 = newrow * 2 - 2;
    if (0 < (int)uVar12) {
      lVar11 = 0;
      do {
        pvVar8 = realloc(*(void **)((long)&video->v_text + lVar11),(ulong)(uint)newcol);
        if (pvVar8 == (void *)0x0) {
          panic("out of memory in display code");
        }
        *(void **)((long)&video->v_text + lVar11) = pvVar8;
        lVar11 = lVar11 + 0x18;
      } while ((ulong)uVar12 * 0x18 != lVar11);
    }
    pcVar9 = (char *)realloc(blanks.v_text,(ulong)(uint)newcol);
    if (pcVar9 == (char *)0x0) {
      panic("out of memory in display code");
    }
  }
  blanks.v_text = pcVar9;
  if (newrow < ttrow) {
    ttrow = newrow;
  }
  if (newcol < ttcol) {
    ttcol = newcol;
  }
  ncol = newcol;
  nrow = newrow;
  vtresize_first_run = 1;
  return 1;
}

Assistant:

int
vtresize(int force, int newrow, int newcol)
{
	int	 i;
	int	 rowchanged, colchanged;
	static	 int first_run = 1;
	struct video	*vp;

	if (newrow < 1 || newcol < 1)
		return (FALSE);

	rowchanged = (newrow != nrow);
	colchanged = (newcol != ncol);

#define TRYREALLOC(a, n) do {					\
		void *tmp;					\
		if ((tmp = realloc((a), (n))) == NULL) {	\
			panic("out of memory in display code");	\
		}						\
		(a) = tmp;					\
	} while (0)

#define TRYREALLOCARRAY(a, n, m) do {				\
		void *tmp;					\
		if ((tmp = reallocarray((a), (n), (m))) == NULL) {\
			panic("out of memory in display code");	\
		}						\
		(a) = tmp;					\
	} while (0)

	/* No update needed */
	if (!first_run && !force && !rowchanged && !colchanged)
		return (TRUE);

	if (first_run)
		memset(&blanks, 0, sizeof(blanks));

	if (rowchanged || first_run) {
		int vidstart;

		/*
		 * This is not pretty.
		 */
		if (nrow == 0)
			vidstart = 0;
		else
			vidstart = 2 * (nrow - 1);

		/*
		 * We're shrinking, free some internal data.
		 */
		if (newrow < nrow) {
			for (i = 2 * (newrow - 1); i < 2 * (nrow - 1); i++) {
				free(video[i].v_text);
				video[i].v_text = NULL;
			}
		}

		TRYREALLOCARRAY(score, newrow, newrow * sizeof(struct score));
		TRYREALLOCARRAY(vscreen, (newrow - 1), sizeof(struct video *));
		TRYREALLOCARRAY(pscreen, (newrow - 1), sizeof(struct video *));
		TRYREALLOCARRAY(video, (newrow - 1), 2 * sizeof(struct video));

		/*
		 * Zero-out the entries we just allocated.
		 */
		for (i = vidstart; i < 2 * (newrow - 1); i++)
			memset(&video[i], 0, sizeof(struct video));

		/*
		 * Reinitialize vscreen and pscreen arrays completely.
		 */
		vp = &video[0];
		for (i = 0; i < newrow - 1; ++i) {
			vscreen[i] = vp;
			++vp;
			pscreen[i] = vp;
			++vp;
		}
	}
	if (rowchanged || colchanged || first_run) {
		for (i = 0; i < 2 * (newrow - 1); i++)
			TRYREALLOC(video[i].v_text, newcol);
		TRYREALLOC(blanks.v_text, newcol);
	}

	nrow = newrow;
	ncol = newcol;

	if (ttrow > nrow)
		ttrow = nrow;
	if (ttcol > ncol)
		ttcol = ncol;

	first_run = 0;
	return (TRUE);
}